

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv_udp_init_ex(uv_loop_t *loop,uv_udp_t *handle,uint flags)

{
  long *plVar1;
  int iVar2;
  uint domain;
  
  domain = flags & 0xff;
  iVar2 = -0x16;
  if ((flags < 0x100) && ((flags & 0xf7) == 2 || domain == 0)) {
    if (domain == 0) {
      iVar2 = -1;
    }
    else {
      iVar2 = uv__socket(domain,2,0);
      if (iVar2 < 0) {
        return iVar2;
      }
    }
    handle->loop = loop;
    handle->type = UV_UDP;
    handle->flags = 0x2000;
    handle->handle_queue[0] = loop->handle_queue;
    plVar1 = (long *)loop->handle_queue[1];
    handle->handle_queue[1] = plVar1;
    *plVar1 = (long)handle->handle_queue;
    loop->handle_queue[1] = handle->handle_queue;
    handle->next_closing = (uv_handle_t *)0x0;
    handle->send_queue_size = 0;
    handle->send_queue_count = 0;
    handle->alloc_cb = (uv_alloc_cb)0x0;
    handle->recv_cb = (uv_udp_recv_cb)0x0;
    uv__io_init(&handle->io_watcher,uv__udp_io,iVar2);
    handle->write_queue[0] = handle->write_queue;
    handle->write_queue[1] = handle->write_queue;
    handle->write_completed_queue[0] = handle->write_completed_queue;
    handle->write_completed_queue[1] = handle->write_completed_queue;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int uv_udp_init_ex(uv_loop_t* loop, uv_udp_t* handle, unsigned int flags) {
  int domain;
  int err;
  int fd;

  /* Use the lower 8 bits for the domain */
  domain = flags & 0xFF;
  if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNSPEC)
    return -EINVAL;

  if (flags & ~0xFF)
    return -EINVAL;

  if (domain != AF_UNSPEC) {
    err = uv__socket(domain, SOCK_DGRAM, 0);
    if (err < 0)
      return err;
    fd = err;
  } else {
    fd = -1;
  }

  uv__handle_init(loop, (uv_handle_t*)handle, UV_UDP);
  handle->alloc_cb = NULL;
  handle->recv_cb = NULL;
  handle->send_queue_size = 0;
  handle->send_queue_count = 0;
  uv__io_init(&handle->io_watcher, uv__udp_io, fd);
  QUEUE_INIT(&handle->write_queue);
  QUEUE_INIT(&handle->write_completed_queue);
  return 0;
}